

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

string * __thiscall
(anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  string *in_RDX;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  if (in_RDX == (string *)0x0) {
    psVar3 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar3;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    anon_unknown.dwarf_5450::xmlEscape(&local_30,(anon_unknown_dwarf_5450 *)this,in_RDX);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x10f0a9);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar4;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    psVar3 = (string *)&local_30.field_2;
    if ((string *)local_30._M_dataplus._M_p != psVar3) {
      operator_delete(local_30._M_dataplus._M_p);
      psVar3 = extraout_RAX;
    }
  }
  return psVar3;
}

Assistant:

std::string TlbExportVisitor::emitSourceID() const
    {
        if (!m_source_id.empty())
            return "source_id=\"" + xmlEscape(m_source_id) + "\"";
        else return std::string();
    }